

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,AssignmentExpression *expr)

{
  bool bVar1;
  
  this->isLValue = true;
  ast::Expression::visit<slang::analysis::DataFlowAnalysis&>(expr->left_,this);
  this->isLValue = false;
  bVar1 = ast::AssignmentExpression::isLValueArg(expr);
  if (!bVar1) {
    ast::Expression::visit<slang::analysis::DataFlowAnalysis&>(expr->right_,this);
  }
  if (expr->timingControl != (TimingControl *)0x0) {
    handleTiming(this,expr->timingControl);
    return;
  }
  return;
}

Assistant:

void DataFlowAnalysis::handle(const AssignmentExpression& expr) {
    // Note that this method mirrors the logic in the base class
    // handler but we need to track the LValue status of the lhs.
    SLANG_ASSERT(!isLValue);
    isLValue = true;
    visit(expr.left());
    isLValue = false;

    if (!expr.isLValueArg())
        visit(expr.right());

    if (expr.timingControl)
        handleTiming(*expr.timingControl);
}